

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2raster.cpp
# Opt level: O0

uint32 rw::ps2::swizzle(uint32 x,uint32 y,uint32 logw)

{
  uint uVar1;
  uint32 n;
  uint32 ny;
  uint32 nx;
  uint32 logw_local;
  uint32 y_local;
  uint32 x_local;
  
  uVar1 = (y >> 1 & 1 ^ y >> 2 & 1) << 2 ^ x;
  return y >> 1 & 1 | (x >> 3 & 1) << 1 | (uVar1 & 7 | uVar1 >> 1 & 0xfffffff8) << 2 |
         (y & 1 | y >> 1 & 0xfffffffe) << ((char)logw + 1U & 0x1f);
}

Assistant:

static uint32
swizzle(uint32 x, uint32 y, uint32 logw)
{
#define X(n) ((x>>(n))&1)
#define Y(n) ((y>>(n))&1)

	uint32 nx, ny, n;
	x ^= (Y(1)^Y(2))<<2;
	nx = (x&7) | ((x>>1)&~7);
	ny = (y&1) | ((y>>1)&~1);
	n = Y(1) | X(3)<<1;
	return n | nx<<2 | ny<<(logw-1+2);
}